

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_context_createIntrinsicClass
          (sysbvm_context_t *context,char *name,sysbvm_tuple_t supertype,...)

{
  char in_AL;
  uint uVar1;
  uint uVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t value;
  size_t sVar4;
  sysbvm_tuple_t *psVar5;
  sysbvm_tuple_t sVar6;
  undefined8 in_RCX;
  long *plVar7;
  ulong uVar8;
  sysbvm_tuple_t flags;
  long *plVar9;
  size_t localIndex;
  undefined8 in_R8;
  sysbvm_tuple_t type;
  undefined8 in_R9;
  long lVar10;
  bool bVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  sysbvm_tuple_t *local_110;
  sysbvm_tuple_t local_e8 [5];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[3] = in_RCX;
  local_e8[4] = in_R8;
  local_c0 = in_R9;
  sVar3 = sysbvm_symbol_internWithCString(context,name);
  value = sysbvm_type_createAnonymousClassAndMetaclass(context,supertype);
  sysbvm_namespace_setNewSymbolBindingWithValue
            (context,(context->roots).globalNamespace,sVar3,value);
  sysbvm_orderedCollection_add(context,(context->roots).intrinsicTypes,value);
  uVar1 = 0x18;
  lVar10 = 0;
  plVar9 = (long *)&stack0x00000008;
  while( true ) {
    if (uVar1 < 0x29) {
      uVar8 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      plVar7 = plVar9;
      plVar9 = (long *)((long)local_e8 + uVar8);
    }
    else {
      plVar7 = plVar9 + 1;
    }
    if (*plVar9 == 0) break;
    if (uVar1 < 0x29) {
      uVar2 = uVar1 + 8;
      if (0x20 < uVar1) goto LAB_00102efa;
      uVar1 = uVar1 + 0x10;
    }
    else {
      plVar7 = plVar7 + 1;
      uVar2 = uVar1;
LAB_00102efa:
      plVar7 = plVar7 + 1;
      uVar1 = uVar2;
    }
    lVar10 = lVar10 + -1;
    plVar9 = plVar7;
  }
  bVar11 = (value & 0xf) == 0;
  if (((bVar11 && value != 0) && ((*(byte *)(value + 8) & 0x80) == 0)) &&
     (uVar8 = *(ulong *)(value + 0x30), (uVar8 & 0xf) == 0 && uVar8 != 0)) {
    sVar4 = sysbvm_type_getTotalSlotCount(uVar8);
  }
  else {
    sVar4 = 0;
  }
  sVar3 = sysbvm_array_create(context,-lVar10);
  uVar1 = 0x18;
  local_110 = (sysbvm_tuple_t *)&stack0x00000008;
  if (lVar10 != 0) {
    localIndex = 0;
    do {
      uVar8 = (ulong)uVar1;
      if (uVar8 < 0x29) {
        uVar1 = uVar1 + 8;
        psVar5 = (sysbvm_tuple_t *)((long)local_e8 + uVar8);
      }
      else {
        psVar5 = local_110;
        local_110 = local_110 + 1;
      }
      sVar6 = sysbvm_symbol_internWithCString(context,(char *)*psVar5);
      uVar8 = (ulong)uVar1;
      if (uVar8 < 0x29) {
        flags = (long)*(int *)((long)local_e8 + uVar8) << 4 | 0xb;
        uVar2 = uVar1 + 8;
        if (0x20 < uVar1) goto LAB_00103023;
        psVar5 = (sysbvm_tuple_t *)((long)local_e8 + uVar8 + 8);
        uVar1 = uVar1 + 0x10;
      }
      else {
        flags = (long)(int)*local_110 << 4 | 0xb;
        local_110 = local_110 + 1;
        uVar2 = uVar1;
LAB_00103023:
        psVar5 = local_110;
        local_110 = local_110 + 1;
        uVar1 = uVar2;
      }
      type = *psVar5;
      if (type == 0) {
        type = (context->roots).anyValueType;
      }
      sVar6 = sysbvm_typeSlot_create(context,value,sVar6,flags,type,localIndex,sVar4 + localIndex);
      if ((sVar3 & 0xf) == 0 && sVar3 != 0) {
        *(sysbvm_tuple_t *)(sVar3 + 0x10 + localIndex * 8) = sVar6;
      }
      localIndex = localIndex + 1;
    } while (-lVar10 != localIndex);
  }
  if (bVar11 && value != 0) {
    *(sysbvm_tuple_t *)(value + 0x38) = sVar3;
  }
  sysbvm_type_setTotalSlotCount(context,value,sVar4 - lVar10);
  sysbvm_type_buildSlotDictionary(context,value);
  return value;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_context_createIntrinsicClass(sysbvm_context_t *context, const char *name, sysbvm_tuple_t supertype, ...)
{
    sysbvm_tuple_t nameSymbol = sysbvm_symbol_internWithCString(context, name);
    sysbvm_tuple_t type = sysbvm_type_createAnonymousClassAndMetaclass(context, supertype);
    sysbvm_namespace_setNewSymbolBindingWithValue(context, context->roots.globalNamespace, nameSymbol, type);
    sysbvm_orderedCollection_add(context, context->roots.intrinsicTypes, type);

    // First pass: count the arguments.
    size_t slotNameCount = 0;
    va_list valist;
    va_start(valist, supertype);
    while(va_arg(valist, const char *))
    {
        va_arg(valist, sysbvm_typeSlotFlags_t);
        va_arg(valist, int);
        ++slotNameCount;
    }
    va_end(valist);

    // Second pass: make the argument list.
    size_t supertypeTotalSlotCount = 0;
    sysbvm_tuple_t actualSupertype = sysbvm_type_getSupertype(type);
    if(sysbvm_tuple_isNonNullPointer(actualSupertype))
        supertypeTotalSlotCount = sysbvm_type_getTotalSlotCount(actualSupertype);

    sysbvm_tuple_t slots = sysbvm_array_create(context, slotNameCount);
    va_start(valist, supertype);
    for(size_t i = 0; i < slotNameCount; ++i)
    {
        sysbvm_tuple_t slotName = sysbvm_symbol_internWithCString(context, va_arg(valist, const char *));
        sysbvm_tuple_t flags = sysbvm_tuple_bitflags_encode(va_arg(valist, int));
        sysbvm_tuple_t slotType = va_arg(valist, sysbvm_tuple_t);
        if(!slotType)
            slotType = context->roots.anyValueType;
        sysbvm_array_atPut(slots, i, sysbvm_typeSlot_create(context, type, slotName, flags, slotType, i, supertypeTotalSlotCount + i));
    }

    va_end(valist);
    sysbvm_type_setSlots(type, slots);
    sysbvm_type_setTotalSlotCount(context, type, supertypeTotalSlotCount + slotNameCount);
    sysbvm_type_buildSlotDictionary(context, type);

    return type;
}